

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void readFile(void)

{
  int iVar1;
  char *pcVar2;
  undefined1 *puVar3;
  double dVar4;
  int local_2784;
  int qq;
  int w;
  int x;
  char ch1 [10000];
  int local_60;
  int j;
  int t;
  string ch;
  int i;
  string local_28 [8];
  string g;
  
  std::__cxx11::string::string(local_28);
  __isoc99_scanf("%f\n\n",&tim);
  __isoc99_scanf("%d\n\n",&nor);
  __isoc99_scanf("%d\n\n",&nob);
  __isoc99_scanf("%d\n\n",&noc);
  for (ch.field_2._8_4_ = 0; (int)ch.field_2._8_4_ < nob; ch.field_2._8_4_ = ch.field_2._8_4_ + 1) {
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    std::__cxx11::string::string((string *)&j);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&j);
    local_60 = 0;
    while (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&j), *pcVar2 != ' ') {
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&j);
      *(undefined1 *)((long)&w + (long)local_60) = *puVar3;
      local_60 = local_60 + 1;
    }
    *(undefined1 *)((long)&w + (long)local_60) = 0;
    iVar1 = atoi((char *)&w);
    tob[(int)ch.field_2._8_4_].cid = iVar1;
    w._0_1_ = 0;
    local_60 = 0;
    while (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&j), *pcVar2 != ' ') {
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&j);
      *(undefined1 *)((long)&w + (long)local_60) = *puVar3;
      local_60 = local_60 + 1;
    }
    *(undefined1 *)((long)&w + (long)local_60) = 0;
    dVar4 = strtod((char *)&w,(char **)0x0);
    tob[(int)ch.field_2._8_4_].price = dVar4;
    qq = 0;
    while (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&j), *pcVar2 != '#') {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&j);
      if (*pcVar2 == ' ') {
        qq = qq + 1;
      }
    }
    tob[(int)ch.field_2._8_4_].norc = qq;
    for (local_2784 = 0; local_2784 < qq; local_2784 = local_2784 + 1) {
      w._0_1_ = 0;
      local_60 = 0;
      while (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&j), *pcVar2 != ' ') {
        puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&j);
        *(undefined1 *)((long)&w + (long)local_60) = *puVar3;
        local_60 = local_60 + 1;
      }
      *(undefined1 *)((long)&w + (long)local_60) = 0;
      iVar1 = atoi((char *)&w);
      *(int *)((long)(int)ch.field_2._8_4_ * 0x9c58 + 0x115204 + (long)local_2784 * 4) = iVar1;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_28);
    std::__cxx11::string::~string((string *)&j);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void readFile()
{

	string g;
	scanf("%f\n\n",&tim);
	scanf("%d\n\n",&nor);
	scanf("%d\n\n",&nob);
	scanf("%d\n\n",&noc);
	for(int i=0;i<nob;i++)
	{
		cout<<flush;
		string ch;
		getline(cin,ch);
		int t=0;int j=0;
		char ch1[max];
		while(ch[t]!=' ')
		{
			ch1[j]=ch[t];
			j++;t++;
		}
		
		ch1[j]='\0';
		tob[i].cid=atoi(ch1);
	
		ch1[0]='\0';j=0;t++;
		while(ch[t]!=' ')
		{
			ch1[j]=ch[t];
			j++;t++;
		}
		ch1[j]='\0';			
		tob[i].price=strtod (ch1, NULL);
		t++;
		
		int x=0;
		int w=t;		
		while(ch[t]!='#')
		{
			if(ch[t]==' ')
			{	x++;}
			t++;
		}
		tob[i].norc=x;
		t=w;
		for(int qq=0;qq<x;qq++)
		{
			ch1[0]='\0';j=0;
			while(ch[t]!=' ')
			{
				ch1[j]=ch[t];
				j++;t++;
			}
			t++;
			ch1[j]='\0';
			tob[i].region[qq]=atoi(ch1);
		}
		getline(cin,g);	
	}
}